

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkPartStitchChoices(Abc_Ntk_t *pNtk,Vec_Ptr_t *vParts)

{
  Nm_Man_t *pNVar1;
  Abc_Aig_t *pMan;
  int iVar2;
  Abc_Ntk_t *pNtk_00;
  Abc_Ntk_t *pAVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  char *pcVar6;
  Vec_Ptr_t *p;
  Hop_Man_t *pMan_00;
  void *pvVar7;
  int iVar8;
  int iVar9;
  char *__format;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPart.c"
                  ,0x3f2,"Abc_Ntk_t *Abc_NtkPartStitchChoices(Abc_Ntk_t *, Vec_Ptr_t *)");
  }
  pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG);
  iVar9 = 0;
  do {
    if (vParts->nSize <= iVar9) {
      for (iVar9 = 0; iVar9 < pNtk->vCos->nSize; iVar9 = iVar9 + 1) {
        pAVar5 = Abc_NtkCo(pNtk,iVar9);
        pAVar4 = (pAVar5->field_6).pCopy;
        if ((pAVar4->vFanins).nSize == 0) {
          pAVar5 = Abc_ObjChild0Copy(pAVar5);
          Abc_ObjAddFanin(pAVar4,pAVar5);
        }
      }
      pMan_00 = Abc_NtkPartStartHop(pNtk_00);
      pAVar3 = Abc_NtkHopRemoveLoops(pNtk_00,pMan_00);
      Abc_NtkDelete(pNtk_00);
      iVar9 = Abc_NtkCheck(pAVar3);
      if (iVar9 == 0) {
        puts("Abc_NtkPartStitchChoices: The network check has failed.");
        Abc_NtkDelete(pAVar3);
        pAVar3 = (Abc_Ntk_t *)0x0;
      }
      return pAVar3;
    }
    pAVar3 = (Abc_Ntk_t *)Vec_PtrEntry(vParts,iVar9);
    if (pAVar3->ntkType != ABC_NTK_STRASH) {
      __assert_fail("Abc_NtkIsStrash(pNtkTemp)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPart.c"
                    ,0x3f8,"Abc_Ntk_t *Abc_NtkPartStitchChoices(Abc_Ntk_t *, Vec_Ptr_t *)");
    }
    Abc_NtkCleanCopy(pAVar3);
    pAVar4 = Abc_AigConst1(pNtk_00);
    pAVar5 = Abc_AigConst1(pAVar3);
    (pAVar5->field_6).pCopy = pAVar4;
    for (iVar8 = 0; iVar8 < pAVar3->vCis->nSize; iVar8 = iVar8 + 1) {
      pAVar4 = Abc_NtkCi(pAVar3,iVar8);
      pNVar1 = pNtk_00->pManName;
      pcVar6 = Abc_ObjName(pAVar4);
      iVar2 = Nm_ManFindIdByNameTwoTypes(pNVar1,pcVar6,2,5);
      if (iVar2 == -1) {
        pcVar6 = Abc_ObjName(pAVar4);
        __format = "Cannot find CI node %s in the original network.\n";
        goto LAB_002a4eb3;
      }
      pAVar5 = Abc_NtkObj(pNtk_00,iVar2);
      (pAVar4->field_6).pCopy = pAVar5;
    }
    p = Abc_AigDfs(pAVar3,1,0);
    for (iVar8 = 0; iVar8 < p->nSize; iVar8 = iVar8 + 1) {
      pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(p,iVar8);
      pMan = (Abc_Aig_t *)pNtk_00->pManFunc;
      pAVar5 = Abc_ObjChild0Copy(pAVar4);
      pAVar5 = Abc_AigAnd(pMan,pAVar5,
                          (Abc_Obj_t *)
                          ((ulong)(*(uint *)&pAVar4->field_0x14 >> 0xb & 1) ^
                          *(ulong *)((long)pAVar4->pNtk->vObjs->pArray[(pAVar4->vFanins).pArray[1]]
                                    + 0x40)));
      (pAVar4->field_6).pCopy = pAVar5;
      if (((ulong)pAVar5 & 1) != 0) {
        __assert_fail("!Abc_ObjIsComplement(pObj->pCopy)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPart.c"
                      ,0x40d,"Abc_Ntk_t *Abc_NtkPartStitchChoices(Abc_Ntk_t *, Vec_Ptr_t *)");
      }
      if (((ulong)pAVar4 & 1) != 0) {
        pcVar6 = "!Abc_ObjIsComplement(pNode)";
LAB_002a4f5f:
        __assert_fail(pcVar6,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                      ,400,"int Abc_AigNodeIsChoice(Abc_Obj_t *)");
      }
      if (pAVar4->pNtk->ntkType != ABC_NTK_STRASH) {
        pcVar6 = "Abc_NtkIsStrash(pNode->pNtk)";
        goto LAB_002a4f5f;
      }
      pvVar7 = (pAVar4->field_5).pData;
      if ((pvVar7 != (void *)0x0) && (0 < (pAVar4->vFanouts).nSize)) {
        for (; pvVar7 != (void *)0x0; pvVar7 = *(void **)((long)pvVar7 + 0x38)) {
          *(Abc_Obj_t **)(*(long *)((long)pvVar7 + 0x40) + 0x40) = pAVar5;
        }
      }
    }
    Vec_PtrFree(p);
    for (iVar8 = 0; iVar8 < pAVar3->vCos->nSize; iVar8 = iVar8 + 1) {
      pAVar4 = Abc_NtkCo(pAVar3,iVar8);
      pNVar1 = pNtk_00->pManName;
      pcVar6 = Abc_ObjName(pAVar4);
      iVar2 = Nm_ManFindIdByNameTwoTypes(pNVar1,pcVar6,3,4);
      if (iVar2 == -1) {
        pcVar6 = Abc_ObjName(pAVar4);
        __format = "Cannot find CO node %s in the original network.\n";
LAB_002a4eb3:
        printf(__format,pcVar6);
        return (Abc_Ntk_t *)0x0;
      }
      pAVar5 = Abc_NtkObj(pNtk_00,iVar2);
      (pAVar4->field_6).pCopy = pAVar5;
      pAVar4 = Abc_ObjChild0Copy(pAVar4);
      Abc_ObjAddFanin(pAVar5,pAVar4);
    }
    iVar9 = iVar9 + 1;
  } while( true );
}

Assistant:

Abc_Ntk_t * Abc_NtkPartStitchChoices( Abc_Ntk_t * pNtk, Vec_Ptr_t * vParts )
{
    extern Abc_Ntk_t * Abc_NtkHopRemoveLoops( Abc_Ntk_t * pNtk, Hop_Man_t * pMan );
    Hop_Man_t * pMan;
    Vec_Ptr_t * vNodes;
    Abc_Ntk_t * pNtkNew, * pNtkTemp;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, iNodeId;

    // start a new network similar to the original one
    assert( Abc_NtkIsStrash(pNtk) );
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_STRASH, ABC_FUNC_AIG );

    // annotate parts to point to the new network
    Vec_PtrForEachEntry( Abc_Ntk_t *, vParts, pNtkTemp, i )
    {
        assert( Abc_NtkIsStrash(pNtkTemp) );
        Abc_NtkCleanCopy( pNtkTemp );

        // map the CI nodes
        Abc_AigConst1(pNtkTemp)->pCopy = Abc_AigConst1(pNtkNew);
        Abc_NtkForEachCi( pNtkTemp, pObj, k )
        {
            iNodeId = Nm_ManFindIdByNameTwoTypes( pNtkNew->pManName, Abc_ObjName(pObj), ABC_OBJ_PI, ABC_OBJ_BO );
            if ( iNodeId == -1 )
            {
                printf( "Cannot find CI node %s in the original network.\n", Abc_ObjName(pObj) );
                return NULL;
            }
            pObj->pCopy = Abc_NtkObj( pNtkNew, iNodeId );
        }

        // add the internal nodes while saving representatives
        vNodes = Abc_AigDfs( pNtkTemp, 1, 0 );
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, k )
        {
            pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
            assert( !Abc_ObjIsComplement(pObj->pCopy) );
            if ( Abc_AigNodeIsChoice(pObj) )
                for ( pFanin = (Abc_Obj_t *)pObj->pData; pFanin; pFanin = (Abc_Obj_t *)pFanin->pData )
                    pFanin->pCopy->pCopy = pObj->pCopy;
        }
        Vec_PtrFree( vNodes );

        // map the CO nodes
        Abc_NtkForEachCo( pNtkTemp, pObj, k )
        {
            iNodeId = Nm_ManFindIdByNameTwoTypes( pNtkNew->pManName, Abc_ObjName(pObj), ABC_OBJ_PO, ABC_OBJ_BI );
            if ( iNodeId == -1 )
            {
                printf( "Cannot find CO node %s in the original network.\n", Abc_ObjName(pObj) );
                return NULL;
            }
            pObj->pCopy = Abc_NtkObj( pNtkNew, iNodeId );
            Abc_ObjAddFanin( pObj->pCopy, Abc_ObjChild0Copy(pObj) );
        }
    }

    // connect the remaining POs
/*
    Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pNtkNew);
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pCopy = Abc_NtkCi( pNtkNew, i );
    Abc_NtkForEachCo( pNtk, pObj, i )
        pObj->pCopy = Abc_NtkCo( pNtkNew, i );
*/
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        if ( Abc_ObjFaninNum(pObj->pCopy) == 0 )
            Abc_ObjAddFanin( pObj->pCopy, Abc_ObjChild0Copy(pObj) );
    }

    // transform into the HOP manager
    pMan = Abc_NtkPartStartHop( pNtkNew );
    pNtkNew = Abc_NtkHopRemoveLoops( pNtkTemp = pNtkNew, pMan );
    Abc_NtkDelete( pNtkTemp );

    // check correctness of the new network
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkPartStitchChoices: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}